

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-extra-test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2992::OutputRedirectTest_FlushErrorInRestoreAndRead_Test::
OutputRedirectTest_FlushErrorInRestoreAndRead_Test
          (OutputRedirectTest_FlushErrorInRestoreAndRead_Test *this)

{
  undefined8 *in_RDI;
  Test *unaff_retaddr;
  
  testing::Test::Test(unaff_retaddr);
  *in_RDI = &PTR__OutputRedirectTest_FlushErrorInRestoreAndRead_Test_001ceb50;
  return;
}

Assistant:

TEST(OutputRedirectTest, FlushErrorInRestoreAndRead) {
  file read_end, write_end;
  file::pipe(read_end, write_end);
  int write_fd = write_end.descriptor();
  file write_copy = write_end.dup(write_fd);
  buffered_file f = write_end.fdopen("w");
  OutputRedirect redir(f.get());
  // Put a character in a file buffer.
  EXPECT_EQ('x', fputc('x', f.get()));
  FMT_POSIX(close(write_fd));
  EXPECT_SYSTEM_ERROR_NOASSERT(redir.restore_and_read(),
      EBADF, "cannot flush stream");
  write_copy.dup2(write_fd);  // "undo" close or dtor will fail
}